

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,BranchIf *b)

{
  CodePrinter *pCVar1;
  size_t sVar2;
  Block *b_00;
  Block *b_01;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string local_48;
  
  text._M_str = "branch_if ";
  text._M_len = 10;
  choc::text::CodePrinter::writeBlock(this->out,text);
  printExpression(this,(b->condition).object);
  pCVar1 = this->out;
  text_00._M_str = " ? ";
  text_00._M_len = 3;
  choc::text::CodePrinter::writeBlock(pCVar1,text_00);
  getBlockName_abi_cxx11_(&local_48,(PrinterStream *)b->targets[0].object,b_00);
  text_01._M_str = local_48._M_dataplus._M_p;
  text_01._M_len = local_48._M_string_length;
  choc::text::CodePrinter::writeBlock(pCVar1,text_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  sVar2 = b->targetArgs[0].numActive;
  if (sVar2 != 0) {
    local_48._M_dataplus._M_p = (pointer)b->targetArgs[0].items;
    local_48._M_string_length = (long)local_48._M_dataplus._M_p + sVar2 * 8;
    printArgList(this,(ArrayView<soul::pool_ref<soul::heart::Expression>_> *)&local_48);
  }
  pCVar1 = this->out;
  text_02._M_str = " : ";
  text_02._M_len = 3;
  choc::text::CodePrinter::writeBlock(pCVar1,text_02);
  getBlockName_abi_cxx11_(&local_48,(PrinterStream *)b->targets[1].object,b_01);
  text_03._M_str = local_48._M_dataplus._M_p;
  text_03._M_len = local_48._M_string_length;
  choc::text::CodePrinter::writeBlock(pCVar1,text_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  sVar2 = b->targetArgs[1].numActive;
  if (sVar2 != 0) {
    local_48._M_dataplus._M_p = (pointer)b->targetArgs[1].items;
    local_48._M_string_length = (long)local_48._M_dataplus._M_p + sVar2 * 8;
    printArgList(this,(ArrayView<soul::pool_ref<soul::heart::Expression>_> *)&local_48);
  }
  return;
}

Assistant:

void printDescription (const heart::BranchIf& b)
        {
            out << "branch_if ";
            printExpression (b.condition);
            out << " ? " << getBlockName (b.targets[0]);

            if (! b.targetArgs[0].empty())
                printArgList (b.targetArgs[0]);

            out << " : " << getBlockName (b.targets[1]);

            if (! b.targetArgs[1].empty())
                printArgList (b.targetArgs[1]);
        }